

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O2

void __thiscall
LSL_RLEZ<TTA>::PerformLabelingMem
          (LSL_RLEZ<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  uint cols;
  int iVar3;
  Mat *m;
  pointer puVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  int r;
  uint uVar6;
  pointer piVar7;
  long lVar8;
  pointer piVar9;
  long lVar10;
  int er;
  long lVar11;
  long lVar12;
  long lVar13;
  void *pvVar14;
  int c;
  void *in_R8;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  allocator_type local_599;
  long local_598;
  long local_590;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_588;
  void *local_580;
  double local_578;
  LSL_RLEZ<TTA> *local_568;
  size_t local_560;
  uint local_554;
  ulong local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  pointer local_528;
  pointer local_520;
  MemVector<int> ner;
  value_type_conflict3 local_4e0;
  MemMat<int> ERA;
  MemMat<int> RLC;
  MemMat<int> ER;
  Mat_<int> local_280;
  MemMat<int> labels;
  MemMat<int> img;
  Mat_<int> local_90;
  
  m = &((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat;
  uVar6 = *(uint *)(m + 8);
  cols = *(uint *)(m + 0xc);
  local_588 = accesses;
  local_568 = this;
  cv::Mat_<int>::Mat_(&local_90,m);
  MemMat<int>::MemMat(&img,&local_90);
  cv::Mat::~Mat(&local_90.super_Mat);
  MemMat<int>::MemMat(&ER,uVar6,cols);
  local_554 = cols + 1;
  MemMat<int>::MemMat(&RLC,uVar6,local_554 & 0xfffffffe);
  MemVector<int>::MemVector(&ner,(long)(int)uVar6);
  local_530 = RLC.accesses_._16_8_;
  local_538 = RLC.accesses_._72_8_;
  local_540 = RLC.img_._16_8_;
  local_548 = RLC.img_._72_8_;
  local_520 = ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
  local_528 = ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  uVar15 = 0;
  local_580 = (void *)0x0;
  if (0 < (int)cols) {
    local_580 = (void *)(ulong)cols;
  }
  local_550 = 0;
  if (0 < (int)uVar6) {
    local_550 = (ulong)uVar6;
  }
  for (; uVar15 != local_550; uVar15 = uVar15 + 1) {
    local_578 = (double)RLC.accesses_._16_8_;
    local_590 = RLC.accesses_._72_8_;
    local_598 = RLC.img_._16_8_;
    iVar18 = 0;
    uVar16 = 0;
    for (in_R8 = (void *)0x0; lVar19 = (long)iVar18, local_580 != in_R8;
        in_R8 = (void *)((long)in_R8 + 1)) {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ +
                      (long)in_R8 * 4);
      *piVar1 = *piVar1 + 1;
      bVar20 = 0 < *(int *)(*(long *)img.img_._72_8_ * uVar15 + img.img_._16_8_ + (long)in_R8 * 4);
      if (uVar16 != bVar20) {
        piVar1 = (int *)(*(long *)RLC.accesses_._72_8_ * uVar15 + RLC.accesses_._16_8_ + lVar19 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        *(int *)(*(long *)RLC.img_._72_8_ * uVar15 + RLC.img_._16_8_ + lVar19 * 4) = (int)in_R8;
        iVar18 = iVar18 + 1;
      }
      piVar1 = (int *)(*(long *)ER.accesses_._72_8_ * uVar15 + ER.accesses_._16_8_ + (long)in_R8 * 4
                      );
      *piVar1 = *piVar1 + 1;
      *(int *)(*(long *)ER.img_._72_8_ * uVar15 + ER.img_._16_8_ + (long)in_R8 * 4) = iVar18;
      uVar16 = (uint)bVar20;
    }
    if (uVar16 != 0) {
      piVar1 = (int *)(*(long *)RLC.accesses_._72_8_ * uVar15 + RLC.accesses_._16_8_ + lVar19 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)RLC.img_._72_8_ * uVar15 + RLC.img_._16_8_ + lVar19 * 4) = cols;
    }
    ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar15] =
         ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start[uVar15] + 1;
    ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar15] = iVar18 + uVar16;
  }
  local_560 = (long)(int)uVar6;
  MemMat<int>::MemMat(&ERA,uVar6,local_554,0);
  uVar2 = *(undefined8 *)&((local_568->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::MemAlloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  TTA::MemSetup();
  for (lVar19 = 1;
      *ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start = *ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1,
      lVar19 <= *ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start; lVar19 = lVar19 + 2) {
    uVar6 = TTA::MemNewLabel();
    piVar1 = (int *)(ERA.accesses_._16_8_ + lVar19 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(ERA.img_._16_8_ + lVar19 * 4) = uVar6;
  }
  lVar17 = 0;
  piVar7 = ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar19 = 1; lVar19 < (long)local_560; lVar19 = lVar19 + 1) {
    lVar13 = lVar19 + -1;
    lVar12 = 1;
    local_598 = lVar13;
    local_590 = lVar19;
    while (piVar7[lVar19] = piVar7[lVar19] + 1, lVar12 <= piVar9[lVar19]) {
      lVar8 = *(long *)RLC.accesses_._72_8_ * lVar19 + RLC.accesses_._16_8_;
      piVar1 = (int *)(lVar8 + -4 + lVar12 * 4);
      *piVar1 = *piVar1 + 1;
      lVar10 = *(long *)RLC.img_._72_8_ * lVar19 + RLC.img_._16_8_;
      iVar18 = *(int *)(lVar10 + -4 + lVar12 * 4);
      piVar1 = (int *)(lVar8 + lVar12 * 4);
      *piVar1 = *piVar1 + 1;
      iVar3 = *(int *)(lVar10 + lVar12 * 4);
      lVar11 = *(long *)ER.accesses_._72_8_ * lVar13 + ER.accesses_._16_8_;
      lVar8 = (long)(int)(iVar18 - (uint)(0 < iVar18));
      piVar1 = (int *)(lVar11 + lVar8 * 4);
      *piVar1 = *piVar1 + 1;
      lVar10 = *(long *)ER.img_._72_8_ * lVar13 + ER.img_._16_8_;
      iVar18 = *(int *)(lVar10 + lVar8 * 4);
      lVar8 = (long)(int)(iVar3 - (uint)((int)cols <= iVar3));
      piVar1 = (int *)(lVar11 + lVar8 * 4);
      *piVar1 = *piVar1 + 1;
      uVar6 = *(uint *)(lVar10 + lVar8 * 4);
      uVar15 = (long)iVar18 | 1;
      iVar18 = uVar6 + (uVar6 & 1) + -1;
      local_578 = (double)lVar12;
      if (iVar18 < (int)uVar15) {
        uVar6 = TTA::MemNewLabel();
      }
      else {
        piVar1 = (int *)(*(long *)ERA.accesses_._72_8_ * lVar13 + ERA.accesses_._16_8_ + uVar15 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        iVar3 = *(int *)(*(long *)ERA.img_._72_8_ * lVar13 + ERA.img_._16_8_ + uVar15 * 4);
        TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar3] =
             TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar3] + 1;
        uVar6 = TTA::mem_rtable_.vec_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3];
        while (uVar15 = uVar15 + 2, lVar19 = local_590, lVar13 = local_598,
              (long)uVar15 <= (long)iVar18) {
          piVar1 = (int *)(*(long *)ERA.accesses_._72_8_ * lVar17 + ERA.accesses_._16_8_ +
                          uVar15 * 4);
          *piVar1 = *piVar1 + 1;
          iVar3 = *(int *)(*(long *)ERA.img_._72_8_ * lVar17 + ERA.img_._16_8_ + uVar15 * 4);
          TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3] =
               TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3] + 1;
          uVar16 = TTA::mem_rtable_.vec_.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
          if ((int)uVar6 < (int)uVar16) {
            TTA::MemUpdateTable(uVar16,uVar6);
          }
          if ((int)uVar16 < (int)uVar6) {
            TTA::MemUpdateTable(uVar6,uVar16);
            uVar6 = uVar16;
          }
        }
      }
      piVar1 = (int *)(*(long *)ERA.accesses_._72_8_ * lVar19 + ERA.accesses_._16_8_ +
                      (long)local_578 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)ERA.img_._72_8_ * lVar19 + ERA.img_._16_8_ + (long)local_578 * 4) = uVar6;
      piVar7 = ner.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = ner.vec_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = (long)local_578 + 2;
    }
    lVar17 = lVar17 + 1;
  }
  uVar6 = TTA::MemFlatten();
  (local_568->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  MemMat<int>::MemMat(&labels,(int)local_560,cols);
  for (uVar15 = 0;
      piVar7 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      puVar4 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start, uVar15 != local_550; uVar15 = uVar15 + 1)
  {
    local_578 = (double)ER.accesses_._72_8_;
    local_590 = ERA.accesses_._16_8_;
    local_598 = ERA.accesses_._72_8_;
    lVar19 = ER.accesses_._16_8_;
    lVar17 = labels.img_._16_8_;
    lVar13 = ER.img_._16_8_;
    pvVar14 = local_580;
    lVar12 = labels.accesses_._16_8_;
    while (bVar20 = pvVar14 != (void *)0x0, pvVar14 = (void *)((long)pvVar14 - 1), bVar20) {
      piVar1 = (int *)(lVar19 + *(long *)ER.accesses_._72_8_ * uVar15);
      *piVar1 = *piVar1 + 1;
      lVar8 = (long)*(int *)(lVar13 + *(long *)ER.img_._72_8_ * uVar15);
      piVar1 = (int *)(*(long *)ERA.accesses_._72_8_ * uVar15 + ERA.accesses_._16_8_ + lVar8 * 4);
      *piVar1 = *piVar1 + 1;
      iVar18 = *(int *)(*(long *)ERA.img_._72_8_ * uVar15 + ERA.img_._16_8_ + lVar8 * 4);
      piVar7[iVar18] = piVar7[iVar18] + 1;
      uVar6 = puVar4[iVar18];
      in_R8 = (void *)(ulong)uVar6;
      piVar1 = (int *)(lVar12 + *(long *)labels.accesses_._72_8_ * uVar15);
      *piVar1 = *piVar1 + 1;
      *(uint *)(lVar17 + *(long *)labels.img_._72_8_ * uVar15) = uVar6;
      lVar12 = lVar12 + 4;
      lVar17 = lVar17 + 4;
      lVar13 = lVar13 + 4;
      lVar19 = lVar19 + 4;
    }
  }
  local_4e0 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_280,4,&local_4e0,
             &local_599);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_588,&local_280);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_280);
  dVar21 = MemMat<int>::GetTotalAccesses(&img);
  *(local_588->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)(dVar21 - 9.223372036854776e+18) & (long)dVar21 >> 0x3f | (long)dVar21;
  dVar21 = MemMat<int>::GetTotalAccesses(&labels);
  pvVar5 = local_588;
  (local_588->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[1] =
       (long)dVar21 >> 0x3f & (long)(dVar21 - 9.223372036854776e+18) | (long)dVar21;
  dVar21 = TTA::MemTotalAccesses();
  (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[2] =
       (long)dVar21 >> 0x3f & (long)(dVar21 - 9.223372036854776e+18) | (long)dVar21;
  local_578 = MemMat<int>::GetTotalAccesses(&ER);
  local_580 = (void *)MemMat<int>::GetTotalAccesses(&RLC);
  dVar21 = MemVector<int>::GetTotalAccesses(&ner);
  dVar22 = MemMat<int>::GetTotalAccesses(&ERA);
  dVar22 = local_578 + (double)local_580 + dVar21 + dVar22;
  uVar15 = (ulong)dVar22;
  pvVar14 = (void *)((long)(dVar22 - 9.223372036854776e+18) & (long)uVar15 >> 0x3f | uVar15);
  (local_588->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[3] = (unsigned_long)pvVar14;
  cv::Mat_<int>::clone(&local_280,(__fn *)&labels.img_,pvVar14,(int)((long)uVar15 >> 0x3f),in_R8);
  cv::Mat::operator=(&((local_568->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                      super_Mat,&local_280.super_Mat);
  cv::Mat::~Mat(&local_280.super_Mat);
  MemMat<int>::~MemMat(&labels);
  MemMat<int>::~MemMat(&ERA);
  MemVector<int>::~MemVector(&ner);
  MemMat<int>::~MemMat(&RLC);
  MemMat<int>::~MemMat(&ER);
  MemMat<int>::~MemMat(&img);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses) {
        int rows = img_.rows;
        int cols = img_.cols;

        MemMat<int> img(img_);

        // Step 1
        MemMat<int> ER(rows, cols);   // Matrix of relative label (1 label/pixel) 
        MemMat<int> RLC(rows, (cols + 1) & ~1); // MISSING in the paper: RLC requires 2 values/run in row, so width must be next multiple of 2
        MemVector<int> ner(rows); //vector<int> ner(rows); // Number of runs 

        for (int r = 0; r < rows; ++r) {
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c)
            {
                x0 = img(r, c) > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC(r, er) = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER(r, c) = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC(r, er) = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
        }